

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_file_from_disk.unit.cpp
# Opt level: O1

void __thiscall
TestLoadJSONFromDisk_TestLoadClear3IGSDBV2JSON_Test::TestBody
          (TestLoadJSONFromDisk_TestLoadClear3IGSDBV2JSON_Test *this)

{
  variant_alternative_t<0UL,_variant<vector<WLData,_allocator<WLData>_>,_DualBandBSDF>_> *pvVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_41;
  path clear_3_path;
  ProductData product;
  char *in_stack_fffffffffffff638;
  AssertHelper local_9c0;
  _Storage<double,_true> local_9b8;
  undefined1 in_stack_fffffffffffff650;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffff651;
  _Alloc_hider val2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  ScopedTrace local_981;
  path local_980;
  ProductData local_958;
  
  testing::ScopedTrace::ScopedTrace
            (&local_981,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x29,"Begin Test: Load CLEAR_3_IGSDB_v2.json from disk.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&local_980,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::_M_append(&local_980,8,"products");
  std::filesystem::__cxx11::path::_M_append(&local_980,0x15,"igsdb_v2_clear_3.json");
  val2._M_p = &stack0xfffffffffffff668;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff658,local_980._M_pathname._M_dataplus._M_p,
             local_980._M_pathname._M_dataplus._M_p + local_980._M_pathname._M_string_length);
  OpticsParser::parseJSONFile(&local_958,(string *)&stack0xfffffffffffff658);
  if (val2._M_p != &stack0xfffffffffffff668) {
    operator_delete(val2._M_p,(ulong)(in_stack_fffffffffffff668 + 1));
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[20]>
            ((internal *)&stack0xfffffffffffff658,"product.name","\"Generic Clear Glass\"",
             &local_958.name,(char (*) [20])"Generic Clear Glass");
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)&stack0xfffffffffffff658,"product.productType","\"GLAZING\"",
             &local_958.productType,(char (*) [8])"GLAZING");
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,char[11]>
            ((internal *)&stack0xfffffffffffff658,"product.productSubtype","\"MONOLITHIC\"",
             &local_958.productSubtype,(char (*) [11])"MONOLITHIC");
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (local_958.thickness.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x118e53,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,in_stack_fffffffffffff650));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  uVar3 = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)&stack0xfffffffffffff658,"product.conductivity","std::optional<double>()",
             &local_958.conductivity,(optional<double> *)&local_9b8);
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (local_958.IRTransmittance.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  local_9b8._M_value = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&stack0xfffffffffffff658,"product.IRTransmittance.value()","0.0",
             (double *)&local_958.IRTransmittance,&local_9b8._M_value);
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (local_958.frontEmissivity.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x11907a,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (local_958.backEmissivity.super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x11913f,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (local_958.measurements.
      super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
      ._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  pvVar1 = std::
           get<0ul,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                     ((variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
                       *)&local_958.measurements);
  local_9b8 = (_Storage<double,_true>)
              (((long)(pvVar1->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  local_9c0.data_._0_4_ = 0x6f;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&stack0xfffffffffffff658,"measurements.size()","111",
             (unsigned_long *)&local_9b8,(int *)&local_9c0);
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x1192d6,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (*(bool *)((long)&(((pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start)->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x119396,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (*(bool *)((long)&(((pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start)->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) == false) {
    std::__throw_bad_optional_access();
  }
  testing::internal::DoubleNearPredFormat
            (in_stack_fffffffffffff638,(char *)0x119456,(char *)in_stack_fffffffffffff668,
             (double)in_stack_fffffffffffff660,(double)val2._M_p,
             (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
  if (SUB81(val2._M_p,0) == (string)0x0) {
    testing::Message::Message((Message *)&local_9b8);
    if (in_stack_fffffffffffff660 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    if (local_9b8 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_9b8 + 8))();
    }
  }
  if (in_stack_fffffffffffff660 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
  }
  if (*(bool *)((long)&(((pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start)->directComponent).
                       super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                       _M_payload + 0x20) != false) {
    testing::internal::DoubleNearPredFormat
              (in_stack_fffffffffffff638,(char *)0x119516,(char *)in_stack_fffffffffffff668,
               (double)in_stack_fffffffffffff660,(double)val2._M_p,
               (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
    if (SUB81(val2._M_p,0) == (string)0x0) {
      testing::Message::Message((Message *)&local_9b8);
      if (in_stack_fffffffffffff660 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_9c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
                 ,0x3e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
      testing::internal::AssertHelper::~AssertHelper(&local_9c0);
      if (local_9b8 != (_Storage<double,_true>)0x0) {
        (**(code **)(*(long *)local_9b8 + 8))();
      }
    }
    if (in_stack_fffffffffffff660 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
    }
    testing::internal::DoubleNearPredFormat
              (in_stack_fffffffffffff638,(char *)0x1195cf,(char *)in_stack_fffffffffffff668,
               (double)in_stack_fffffffffffff660,(double)val2._M_p,
               (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
    if (SUB81(val2._M_p,0) == (string)0x0) {
      testing::Message::Message((Message *)&local_9b8);
      if (in_stack_fffffffffffff660 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_9c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
      testing::internal::AssertHelper::~AssertHelper(&local_9c0);
      if (local_9b8 != (_Storage<double,_true>)0x0) {
        (**(code **)(*(long *)local_9b8 + 8))();
      }
    }
    if (in_stack_fffffffffffff660 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
    }
    if (*(bool *)((long)&(pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start[0x6e].directComponent.
                         super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                         _M_payload + 0x20) == false) {
      std::__throw_bad_optional_access();
    }
    testing::internal::DoubleNearPredFormat
              (in_stack_fffffffffffff638,(char *)0x119695,(char *)in_stack_fffffffffffff668,
               (double)in_stack_fffffffffffff660,(double)val2._M_p,
               (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
    if (SUB81(val2._M_p,0) == (string)0x0) {
      testing::Message::Message((Message *)&local_9b8);
      if (in_stack_fffffffffffff660 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_9c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
                 ,0x40,pcVar2);
      testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
      testing::internal::AssertHelper::~AssertHelper(&local_9c0);
      if (local_9b8 != (_Storage<double,_true>)0x0) {
        (**(code **)(*(long *)local_9b8 + 8))();
      }
    }
    if (in_stack_fffffffffffff660 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
    }
    if (*(bool *)((long)&(pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start[0x6e].directComponent.
                         super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                         _M_payload + 0x20) == false) {
      std::__throw_bad_optional_access();
    }
    testing::internal::DoubleNearPredFormat
              (in_stack_fffffffffffff638,(char *)0x11975b,(char *)in_stack_fffffffffffff668,
               (double)in_stack_fffffffffffff660,(double)val2._M_p,
               (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
    if (SUB81(val2._M_p,0) == (string)0x0) {
      testing::Message::Message((Message *)&local_9b8);
      if (in_stack_fffffffffffff660 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_9c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
                 ,0x41,pcVar2);
      testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
      testing::internal::AssertHelper::~AssertHelper(&local_9c0);
      if (local_9b8 != (_Storage<double,_true>)0x0) {
        (**(code **)(*(long *)local_9b8 + 8))();
      }
    }
    if (in_stack_fffffffffffff660 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
    }
    if (*(bool *)((long)&(pvVar1->
                         super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                         )._M_impl.super__Vector_impl_data._M_start[0x6e].directComponent.
                         super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
                         _M_payload + 0x20) != false) {
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffff638,(char *)0x119821,(char *)in_stack_fffffffffffff668,
                 (double)in_stack_fffffffffffff660,(double)val2._M_p,
                 (double)CONCAT71(in_stack_fffffffffffff651,uVar3));
      if (SUB81(val2._M_p,0) == (string)0x0) {
        testing::Message::Message((Message *)&local_9b8);
        if (in_stack_fffffffffffff660 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (in_stack_fffffffffffff660->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_9c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
                   ,0x42,pcVar2);
        testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9b8);
        testing::internal::AssertHelper::~AssertHelper(&local_9c0);
        if (local_9b8 != (_Storage<double,_true>)0x0) {
          (**(code **)(*(long *)local_9b8 + 8))();
        }
      }
      if (in_stack_fffffffffffff660 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xfffffffffffff660,in_stack_fffffffffffff660);
      }
      OpticsParser::ProductData::~ProductData(&local_958);
      std::filesystem::__cxx11::path::~path(&local_980);
      testing::ScopedTrace::~ScopedTrace(&local_981);
      return;
    }
    std::__throw_bad_optional_access();
  }
  std::__throw_bad_optional_access();
}

Assistant:

TEST(TestLoadJSONFromDisk, TestLoadClear3IGSDBV2JSON)
{
    SCOPED_TRACE("Begin Test: Load CLEAR_3_IGSDB_v2.json from disk.");

    std::filesystem::path clear_3_path(TEST_DATA_DIR);
    clear_3_path /= "products";
    clear_3_path /= "igsdb_v2_clear_3.json";

    auto product = OpticsParser::parseJSONFile(clear_3_path.string());
    //    EXPECT_EQ(product.nfrcid.value(), 102);
    EXPECT_EQ(product.name, "Generic Clear Glass");
    EXPECT_EQ(product.productType, "GLAZING");
    EXPECT_EQ(product.productSubtype, "MONOLITHIC");
    EXPECT_NEAR(product.thickness.value(), 3.048, 1e-6);
    EXPECT_EQ(product.conductivity, std::optional<double>());
    EXPECT_EQ(product.IRTransmittance.value(), 0.0);
    EXPECT_NEAR(product.frontEmissivity.value(), 0.84, 1e-6);
    EXPECT_NEAR(product.backEmissivity.value(), 0.84, 1e-6);
    auto & measurements = std::get<std::vector<OpticsParser::WLData>>(product.measurements.value());
    EXPECT_EQ(measurements.size(), 111);
    EXPECT_NEAR(measurements[0].wavelength, 0.3, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().tf, 0.002, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().rf, 0.047, 1e-6);
    EXPECT_NEAR(measurements[0].directComponent.value().rb, 0.048, 1e-6);
    EXPECT_NEAR(measurements[110].wavelength, 2.5, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().tf, 0.822, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().rf, 0.068, 1e-6);
    EXPECT_NEAR(measurements[110].directComponent.value().rb, 0.068, 1e-6);
}